

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O2

string * __thiscall
Assimp::FBX::ParseTokenAsString_abi_cxx11_(string *__return_storage_ptr__,FBX *this,Token *t)

{
  char **in_RCX;
  char *err;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  string local_38;
  
  ParseTokenAsString_abi_cxx11_(&local_60,this,(Token *)local_40,in_RCX);
  if (local_40 == (undefined1  [8])0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)(local_40 + 8),(char *)local_40,&local_61);
  anon_unknown.dwarf_daa89d::ParseError((string *)(local_40 + 8),(Token *)this);
}

Assistant:

std::string ParseTokenAsString(const Token& t)
{
    const char* err;
    const std::string& i = ParseTokenAsString(t,err);
    if(err) {
        ParseError(err,t);
    }
    return i;
}